

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport2.c
# Opt level: O0

kexinit_algorithm * ssh2_kexinit_addalg_pl(kexinit_algorithm_list *list,ptrlen name)

{
  size_t sVar1;
  _Bool _Var2;
  kexinit_algorithm *pkVar3;
  kexinit_algorithm *entry;
  size_t i;
  kexinit_algorithm_list *list_local;
  ptrlen name_local;
  
  entry = (kexinit_algorithm *)0x0;
  while( true ) {
    if ((kexinit_algorithm *)list->nalgs <= entry) {
      pkVar3 = (kexinit_algorithm *)
               safegrowarray(list->algs,&list->algsize,0x20,list->nalgs,1,false);
      list->algs = pkVar3;
      sVar1 = list->nalgs;
      list->nalgs = sVar1 + 1;
      pkVar3 = list->algs + sVar1;
      (pkVar3->name).ptr = name.ptr;
      (pkVar3->name).len = name.len;
      return pkVar3;
    }
    _Var2 = ptrlen_eq_ptrlen(list->algs[(long)entry].name,name);
    if (_Var2) break;
    entry = (kexinit_algorithm *)((long)&(entry->name).ptr + 1);
  }
  return list->algs + (long)entry;
}

Assistant:

static struct kexinit_algorithm *ssh2_kexinit_addalg_pl(
    struct kexinit_algorithm_list *list, ptrlen name)
{
    for (size_t i = 0; i < list->nalgs; i++)
        if (ptrlen_eq_ptrlen(list->algs[i].name, name))
            return &list->algs[i];

    sgrowarray(list->algs, list->algsize, list->nalgs);
    struct kexinit_algorithm *entry = &list->algs[list->nalgs++];
    entry->name = name;
    return entry;
}